

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChLinkRackpinion::GetAbsRackPos
          (ChVector<double> *__return_storage_ptr__,ChLinkRackpinion *this)

{
  ChQuaternion<double> local_c0;
  ChFrame<double> local_a0;
  
  if ((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2 == (ChBodyFrame *)0x0) {
    __return_storage_ptr__->m_data[0] = VNULL;
    __return_storage_ptr__->m_data[1] = DAT_00b90ac0;
    local_a0.coord.pos.m_data[2] = DAT_00b90ac8;
  }
  else {
    local_c0.m_data[0] = 1.0;
    local_c0.m_data[1] = 0.0;
    local_c0.m_data[2] = 0.0;
    local_c0.m_data[3] = 0.0;
    local_a0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_a0.coord.pos.m_data[0] = 0.0;
    local_a0.coord.pos.m_data[1] = 0.0;
    local_a0.coord.pos.m_data[2] = 0.0;
    local_a0.coord.rot.m_data[0] = 1.0;
    local_a0.coord.rot.m_data[1] = 0.0;
    local_a0.coord.rot.m_data[2] = 0.0;
    local_a0.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_a0.Amatrix,&local_c0);
    ChFrame<double>::TransformLocalToParent
              ((ChFrame<double> *)
               (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2,&this->local_rack
               ,&local_a0);
    __return_storage_ptr__->m_data[0] = local_a0.coord.pos.m_data[0];
    __return_storage_ptr__->m_data[1] = local_a0.coord.pos.m_data[1];
  }
  __return_storage_ptr__->m_data[2] = local_a0.coord.pos.m_data[2];
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChLinkRackpinion::GetAbsRackPos() {
    if (this->Body2) {
        ChFrame<double> absframe;
        ((ChFrame<double>*)Body2)->TransformLocalToParent(local_rack, absframe);
        return absframe.GetPos();
    } else
        return VNULL;
}